

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  char *test_suite_name;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  TestInfo *pTVar5;
  size_t width;
  size_t width_00;
  TimeInMillis ms;
  TimeInMillis ms_00;
  size_t width_01;
  int i;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string kIndent;
  string kTestsuite;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&kTestsuite,"testsuite",(allocator<char> *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0x6,width);
  Indent_abi_cxx11_(&local_b8,(internal *)&DAT_00000004,width_00);
  poVar4 = std::operator<<(stream,(string *)&local_b8);
  std::operator<<(poVar4,"{\n");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"name",&local_b9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,(test_suite->name_)._M_dataplus._M_p,&local_91);
  OutputJsonKey(stream,&kTestsuite,&local_b8,&local_90,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"tests",(allocator<char> *)&local_90);
  iVar3 = TestSuite::reportable_test_count(test_suite);
  OutputJsonKey(stream,&kTestsuite,&local_b8,iVar3,&kIndent,true);
  std::__cxx11::string::~string((string *)&local_b8);
  if (FLAGS_gtest_list_tests == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"failures",(allocator<char> *)&local_90);
    iVar3 = TestSuite::failed_test_count(test_suite);
    OutputJsonKey(stream,&kTestsuite,&local_b8,iVar3,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"disabled",(allocator<char> *)&local_90);
    iVar3 = TestSuite::reportable_disabled_test_count(test_suite);
    OutputJsonKey(stream,&kTestsuite,&local_b8,iVar3,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"errors",(allocator<char> *)&local_90);
    OutputJsonKey(stream,&kTestsuite,&local_b8,0,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"timestamp",&local_b9);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_90,(internal *)test_suite->start_timestamp_,ms);
    OutputJsonKey(stream,&kTestsuite,&local_b8,&local_90,&kIndent,true);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"time",&local_b9);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_90,(internal *)test_suite->elapsed_time_,ms_00);
    OutputJsonKey(stream,&kTestsuite,&local_b8,&local_90,&kIndent,false);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    TestPropertiesAsJson(&local_b8,&test_suite->ad_hoc_test_result_,&kIndent);
    poVar4 = std::operator<<(stream,(string *)&local_b8);
    std::operator<<(poVar4,",\n");
    std::__cxx11::string::~string((string *)&local_b8);
  }
  poVar4 = std::operator<<(stream,(string *)&kIndent);
  poVar4 = std::operator<<(poVar4,"\"");
  poVar4 = std::operator<<(poVar4,(string *)&kTestsuite);
  std::operator<<(poVar4,"\": [\n");
  bVar1 = false;
  for (iVar3 = 0;
      iVar3 < (int)((ulong)((long)(test_suite->test_info_list_).
                                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(test_suite->test_info_list_).
                                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3); iVar3 = iVar3 + 1
      ) {
    pTVar5 = TestSuite::GetTestInfo(test_suite,iVar3);
    if ((pTVar5->matches_filter_ == true) && ((pTVar5->is_in_another_shard_ & 1U) == 0)) {
      bVar2 = true;
      if (bVar1) {
        std::operator<<(stream,",\n");
        bVar2 = bVar1;
      }
      test_suite_name = (test_suite->name_)._M_dataplus._M_p;
      pTVar5 = TestSuite::GetTestInfo(test_suite,iVar3);
      OutputJsonTestInfo(stream,test_suite_name,pTVar5);
      bVar1 = bVar2;
    }
  }
  bVar2 = TestResult::Failed(&test_suite->ad_hoc_test_result_);
  if (bVar2) {
    if (bVar1) {
      std::operator<<(stream,",\n");
    }
    OutputJsonTestCaseForTestResult(stream,&test_suite->ad_hoc_test_result_);
  }
  poVar4 = std::operator<<(stream,"\n");
  poVar4 = std::operator<<(poVar4,(string *)&kIndent);
  poVar4 = std::operator<<(poVar4,"]\n");
  Indent_abi_cxx11_(&local_b8,(internal *)&DAT_00000004,width_01);
  poVar4 = std::operator<<(poVar4,(string *)&local_b8);
  std::operator<<(poVar4,"}");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&kIndent);
  std::__cxx11::string::~string((string *)&kTestsuite);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestSuite(
    std::ostream* stream, const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  const std::string kIndent = Indent(6);

  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, kTestsuite, "name", test_suite.name(), kIndent);
  OutputJsonKey(stream, kTestsuite, "tests", test_suite.reportable_test_count(),
                kIndent);
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, kTestsuite, "failures",
                  test_suite.failed_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "disabled",
                  test_suite.reportable_disabled_test_count(), kIndent);
    OutputJsonKey(stream, kTestsuite, "errors", 0, kIndent);
    OutputJsonKey(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsRFC3339(test_suite.start_timestamp()),
        kIndent);
    OutputJsonKey(stream, kTestsuite, "time",
                  FormatTimeInMillisAsDuration(test_suite.elapsed_time()),
                  kIndent, false);
    *stream << TestPropertiesAsJson(test_suite.ad_hoc_test_result(), kIndent)
            << ",\n";
  }

  *stream << kIndent << "\"" << kTestsuite << "\": [\n";

  bool comma = false;
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable()) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      OutputJsonTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
    }
  }

  // If there was a failure in the test suite setup or teardown include that in
  // the output.
  if (test_suite.ad_hoc_test_result().Failed()) {
    if (comma) {
      *stream << ",\n";
    }
    OutputJsonTestCaseForTestResult(stream, test_suite.ad_hoc_test_result());
  }

  *stream << "\n" << kIndent << "]\n" << Indent(4) << "}";
}